

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O2

Svg_doc * extract_svg_doc(Svg_doc *__return_storage_ptr__,FT_Byte *stream)

{
  uint uVar1;
  
  __return_storage_ptr__->start_glyph_id = *(ushort *)stream << 8 | *(ushort *)stream >> 8;
  __return_storage_ptr__->end_glyph_id = *(ushort *)(stream + 2) << 8 | *(ushort *)(stream + 2) >> 8
  ;
  uVar1 = *(uint *)(stream + 4);
  __return_storage_ptr__->offset =
       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  uVar1 = *(uint *)(stream + 8);
  __return_storage_ptr__->length =
       (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  return __return_storage_ptr__;
}

Assistant:

static Svg_doc
  extract_svg_doc( FT_Byte*  stream )
  {
    Svg_doc  doc;


    doc.start_glyph_id = FT_NEXT_USHORT( stream );
    doc.end_glyph_id   = FT_NEXT_USHORT( stream );

    doc.offset = FT_NEXT_ULONG( stream );
    doc.length = FT_NEXT_ULONG( stream );

    return doc;
  }